

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Get_block_info(int g_a,int *num_blocks,int *block_dims)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int i_1;
  int i;
  Integer _ga_lo [7];
  Integer _ga_work [7];
  Integer ndim;
  Integer aa;
  int local_b0;
  int local_ac;
  undefined8 local_a8 [3];
  Integer *in_stack_ffffffffffffff70;
  Integer *in_stack_ffffffffffffff78;
  Integer in_stack_ffffffffffffff80;
  undefined8 local_68 [8];
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = (long)in_EDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = pnga_get_dimension(local_20);
  pnga_get_block_info(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70)
  ;
  for (local_ac = 0; local_ac < local_28; local_ac = local_ac + 1) {
    *(int *)(local_10 + ((local_28 - local_ac) + -1) * 4) = (int)local_68[local_ac];
  }
  for (local_b0 = 0; local_b0 < local_28; local_b0 = local_b0 + 1) {
    *(int *)(local_18 + ((local_28 - local_b0) + -1) * 4) = (int)local_a8[local_b0];
  }
  return;
}

Assistant:

void NGA_Get_block_info(int g_a, int num_blocks[], int block_dims[])
{
     Integer aa, ndim;
     Integer _ga_work[MAXDIM], _ga_lo[MAXDIM];
     aa = (Integer)g_a;
     ndim = wnga_get_dimension(aa);
     wnga_get_block_info(aa, _ga_work, _ga_lo);
     COPYF2C(_ga_work,num_blocks, ndim);
     COPYF2C(_ga_lo,block_dims, ndim);
}